

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

void sysbvm_integer_decodeLargeOrImmediate
               (sysbvm_context_t *context,sysbvm_decoded_integer_t *decodedInteger,
               sysbvm_tuple_t integer)

{
  ulong uVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_integer_t *integerObject;
  
  if ((integer & 0xf) == 0) {
    if (integer == 0) {
      sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,0);
    }
    else {
      sVar3 = *(sysbvm_tuple_t *)integer;
    }
    decodedInteger->isNegative = sVar3 == (context->roots).largeNegativeIntegerType;
    decodedInteger->words = (uint32_t *)(integer + 0x10);
    if (integer == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)(*(uint *)(integer + 0xc) >> 2);
    }
    if (1 < (uint)uVar2) {
      do {
        if (*(int *)(integer + 0xc + uVar2 * 4) != 0) goto LAB_0011e8bd;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
      uVar2 = 1;
    }
  }
  else {
    uVar1 = (long)integer >> 4;
    uVar2 = -uVar1;
    if (0 < (long)uVar1) {
      uVar2 = uVar1;
    }
    decodedInteger->isNegative = SUB81(integer >> 0x3f,0);
    decodedInteger->inlineWordBuffer[0] = (uint32_t)uVar2;
    decodedInteger->inlineWordBuffer[1] = (uint32_t)(uVar2 >> 0x20);
    decodedInteger->words = decodedInteger->inlineWordBuffer;
    uVar2 = 2 - (ulong)(uVar2 >> 0x20 == 0);
  }
LAB_0011e8bd:
  decodedInteger->wordCount = uVar2;
  return;
}

Assistant:

static void sysbvm_integer_decodeLargeOrImmediate(sysbvm_context_t *context, sysbvm_decoded_integer_t *decodedInteger, sysbvm_tuple_t integer)
{
    if(sysbvm_tuple_isImmediate(integer))
    {
        // Decode the small integer.
        sysbvm_stuple_t decodedSmall = sysbvm_tuple_integer_decodeSmall(integer);
        uint64_t decodedSmallPositive = decodedSmall >= 0 ? (uint64_t)decodedSmall : (uint64_t)(-decodedSmall);

        decodedInteger->isNegative = decodedSmall < 0;
        decodedInteger->inlineWordBuffer[0] = (uint32_t)decodedSmallPositive;
        decodedInteger->inlineWordBuffer[1] = (uint32_t)(decodedSmallPositive >> 32);
        decodedInteger->words = decodedInteger->inlineWordBuffer;
        decodedInteger->wordCount = decodedInteger->inlineWordBuffer[1] == 0 ? 1 : 2;
    }
    else
    {
        // Decode the large integer.
        sysbvm_integer_t *integerObject = (sysbvm_integer_t*)integer;
        decodedInteger->isNegative = sysbvm_tuple_getType(context, integer) == context->roots.largeNegativeIntegerType;
        decodedInteger->words = integerObject->words;
        decodedInteger->wordCount = sysbvm_tuple_getSizeInBytes(integer) / 4;

        // Normalize the word count.
        while(decodedInteger->wordCount > 1 && decodedInteger->words[decodedInteger->wordCount - 1] == 0)
            --decodedInteger->wordCount;
    }
}